

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# all.hpp
# Opt level: O0

timer_type * __thiscall
timertt::details::
timer_wheel_engine<timertt::thread_safety::safe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>
::make_exec_list(timer_wheel_engine<timertt::thread_safety::safe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>
                 *this)

{
  timer_type *ptVar1;
  reference pvVar2;
  timer_type *t;
  timer_type *timer;
  timer_type *tail;
  timer_type *head;
  timer_wheel_engine<timertt::thread_safety::safe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>
  *this_local;
  
  tail = (timer_type *)0x0;
  timer = (timer_type *)0x0;
  pvVar2 = std::
           vector<timertt::details::timer_wheel_engine<timertt::thread_safety::safe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>::wheel_item,_std::allocator<timertt::details::timer_wheel_engine<timertt::thread_safety::safe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>::wheel_item>_>
           ::operator[](&this->m_wheel,(ulong)this->m_current_position);
  t = pvVar2->m_head;
  while (t != (timer_type *)0x0) {
    if (t->m_full_rolls_left == 0) {
      ptVar1 = t->m_next;
      remove_timer_from_wheel(this,t);
      std::atomic<timertt::details::timer_status>::operator=
                ((atomic<timertt::details::timer_status> *)
                 &(t->super_timer_object<timertt::thread_safety::safe>).field_0xc,wait_for_execution
                );
      if (tail == (timer_type *)0x0) {
        tail = t;
        t->m_next = (timer_type *)0x0;
        t->m_prev = (timer_type *)0x0;
      }
      else {
        timer->m_next = t;
        t->m_prev = timer;
        t->m_next = (timer_type *)0x0;
      }
      timer = t;
      t = ptVar1;
    }
    else {
      t->m_full_rolls_left = t->m_full_rolls_left - 1;
      t = t->m_next;
    }
  }
  return tail;
}

Assistant:

timer_type *
	make_exec_list()
	{
		timer_type * head = nullptr;
		timer_type * tail = nullptr;

		timer_type * timer = m_wheel[ m_current_position ].m_head;
		while( timer )
		{
			if( timer->m_full_rolls_left )
			{
				timer->m_full_rolls_left -= 1;
				timer = timer->m_next;
			}
			else
			{
				timer_type * t = timer;
				timer = timer->m_next;

				remove_timer_from_wheel( t );
				t->m_status = timer_status::wait_for_execution;

				if( head )
				{
					tail->m_next = t;
					t->m_prev = tail;
					t->m_next = nullptr;
					tail = t;
				}
				else
				{
					head = tail = t;
					t->m_prev = t->m_next = nullptr;
				}
			}
		}

		return head;
	}